

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_state_callback_force(callback_type_e c_type)

{
  fio_ls_embd_s *pfVar1;
  fio_ls_embd_s *pfVar2;
  fio_ls_embd_s *pfVar3;
  fio_ls_embd_s *pfVar4;
  fio_defer_task_s task;
  fio_ls_embd_s *pfVar5;
  fio_ls_embd_s *pfVar6;
  int *piVar7;
  char *format;
  callback_data_s *tmp;
  fio_lock_i ret;
  fio_ls_embd_s copy;
  
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK)) {
    copy.prev = &copy;
    copy.next = &copy;
    fio_lock(&callback_collection[c_type].lock);
    pfVar6 = callback_collection[c_type].callbacks.next;
    if (pfVar6 == (fio_ls_embd_s *)0x0) {
      pfVar6 = &callback_collection[c_type].callbacks;
      callback_collection[c_type].callbacks.prev = pfVar6;
      callback_collection[c_type].callbacks.next = pfVar6;
    }
    pfVar1 = &callback_collection[c_type].callbacks;
    if (c_type < FIO_CALL_ON_IDLE) {
      for (; pfVar6 != pfVar1; pfVar6 = pfVar6->next) {
        pfVar5 = (fio_ls_embd_s *)fio_malloc(0x20);
        if (pfVar5 == (fio_ls_embd_s *)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            format = 
            "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:3367"
            ;
LAB_0010812d:
            FIO_LOG2STDERR(format);
          }
LAB_00108134:
          kill(0,2);
          piVar7 = __errno_location();
          exit(*piVar7);
        }
        pfVar2 = pfVar6->prev;
        pfVar3 = pfVar6->next;
        pfVar4 = pfVar6[1].next;
        pfVar5[1].prev = pfVar6[1].prev;
        pfVar5[1].next = pfVar4;
        pfVar5->prev = pfVar2;
        pfVar5->next = pfVar3;
        fio_ls_embd_push(copy.next,pfVar5);
      }
    }
    else if (c_type == FIO_CALL_ON_IDLE) {
      for (; pfVar6 != pfVar1; pfVar6 = pfVar6->next) {
        task.arg1 = pfVar6[1].prev;
        task.func = fio_state_on_idle_perform;
        task.arg2 = pfVar6[1].next;
        fio_defer_push_task_fn(task,&task_queue_normal);
      }
    }
    else {
      for (; pfVar6 != pfVar1; pfVar6 = pfVar6->next) {
        pfVar5 = (fio_ls_embd_s *)fio_malloc(0x20);
        if (pfVar5 == (fio_ls_embd_s *)0x0) {
          if (FIO_LOG_LEVEL < 1) goto LAB_00108134;
          format = 
          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:3390"
          ;
          goto LAB_0010812d;
        }
        pfVar2 = pfVar6->prev;
        pfVar3 = pfVar6->next;
        pfVar4 = pfVar6[1].next;
        pfVar5[1].prev = pfVar6[1].prev;
        pfVar5[1].next = pfVar4;
        pfVar5->prev = pfVar2;
        pfVar5->next = pfVar3;
        pfVar5->prev = copy.prev;
        pfVar5->next = &copy;
        (copy.prev)->next = pfVar5;
        copy.prev = pfVar5;
      }
    }
    LOCK();
    callback_collection[c_type].lock = '\0';
    UNLOCK();
    while (copy.next != &copy) {
      pfVar6 = fio_ls_embd_remove(copy.prev);
      if (pfVar6[1].prev != (fio_ls_embd_s *)0x0) {
        (*(code *)pfVar6[1].prev)(pfVar6[1].next);
      }
      fio_free(pfVar6);
    }
  }
  return;
}

Assistant:

void fio_state_callback_force(callback_type_e c_type) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  /* copy collection */
  fio_ls_embd_s copy = FIO_LS_INIT(copy);
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  switch (c_type) {            /* the difference between `unshift` and `push` */
  case FIO_CALL_ON_INITIALIZE: /* fallthrough */
  case FIO_CALL_PRE_START:     /* fallthrough */
  case FIO_CALL_BEFORE_FORK:   /* fallthrough */
  case FIO_CALL_AFTER_FORK:    /* fallthrough */
  case FIO_CALL_IN_CHILD:      /* fallthrough */
  case FIO_CALL_IN_MASTER:     /* fallthrough */
  case FIO_CALL_ON_START:      /* fallthrough */
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = fio_malloc(sizeof(*tmp));
      FIO_ASSERT_ALLOC(tmp);
      *tmp = *(FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
      fio_ls_embd_unshift(&copy, &tmp->node);
    }
    break;

  case FIO_CALL_ON_IDLE: /* idle callbacks are orderless and evented */
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = FIO_LS_EMBD_OBJ(callback_data_s, node, pos);
      fio_defer_push_task(fio_state_on_idle_perform,
                          (void *)(uintptr_t)tmp->func, tmp->arg);
    }
    break;

  case FIO_CALL_ON_SHUTDOWN:     /* fallthrough */
  case FIO_CALL_ON_FINISH:       /* fallthrough */
  case FIO_CALL_ON_PARENT_CRUSH: /* fallthrough */
  case FIO_CALL_ON_CHILD_CRUSH:  /* fallthrough */
  case FIO_CALL_AT_EXIT:         /* fallthrough */
  case FIO_CALL_NEVER:           /* fallthrough */
  default:
    FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
      callback_data_s *tmp = fio_malloc(sizeof(*tmp));
      FIO_ASSERT_ALLOC(tmp);
      *tmp = *(FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
      fio_ls_embd_push(&copy, &tmp->node);
    }
    break;
  }

  fio_unlock(&callback_collection[c_type].lock);
  /* run callbacks + free data */
  while (fio_ls_embd_any(&copy)) {
    callback_data_s *tmp =
        FIO_LS_EMBD_OBJ(callback_data_s, node, fio_ls_embd_pop(&copy));
    if (tmp->func) {
      tmp->func(tmp->arg);
    }
    fio_free(tmp);
  }
}